

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

void __thiscall
gl4cts::CopyImage::SamplesMissMatchTest::SamplesMissMatchTest
          (SamplesMissMatchTest *this,Context *context)

{
  uint local_3c;
  uint local_38;
  GLuint dst_target;
  GLuint src_target;
  GLuint dst_sample;
  GLuint src_sample;
  testCase test_case;
  Context *context_local;
  SamplesMissMatchTest *this_local;
  
  test_case._12_8_ = context;
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"samples_missmatch",
             "Test verifies if INVALID_OPERATION is generated when textures provided to CopySubImageData have different number of samples"
            );
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SamplesMissMatchTest_0321e6c0;
  this->m_dst_tex_name = 0;
  this->m_src_tex_name = 0;
  this->m_test_case_index = 0;
  std::
  vector<gl4cts::CopyImage::SamplesMissMatchTest::testCase,_std::allocator<gl4cts::CopyImage::SamplesMissMatchTest::testCase>_>
  ::vector(&this->m_test_cases);
  for (src_target = 0; src_target < 2; src_target = src_target + 1) {
    for (dst_target = 0; dst_target < 2; dst_target = dst_target + 1) {
      for (local_38 = 0; local_38 < 2; local_38 = local_38 + 1) {
        for (local_3c = 0; local_3c < 2; local_3c = local_3c + 1) {
          dst_sample = SamplesMissMatchTest::targets[local_38];
          src_sample = SamplesMissMatchTest::n_samples[src_target];
          test_case.m_src_target = SamplesMissMatchTest::targets[local_3c];
          test_case.m_src_n_samples = SamplesMissMatchTest::n_samples[dst_target];
          if (src_sample == test_case.m_src_n_samples) {
            test_case.m_dst_target = 0;
          }
          else {
            test_case.m_dst_target = 0x502;
          }
          std::
          vector<gl4cts::CopyImage::SamplesMissMatchTest::testCase,_std::allocator<gl4cts::CopyImage::SamplesMissMatchTest::testCase>_>
          ::push_back(&this->m_test_cases,(value_type *)&dst_sample);
        }
      }
    }
  }
  return;
}

Assistant:

SamplesMissMatchTest::SamplesMissMatchTest(deqp::Context& context)
	: TestCase(context, "samples_missmatch", "Test verifies if INVALID_OPERATION is generated when textures provided "
											 "to CopySubImageData have different number of samples")
	, m_dst_tex_name(0)
	, m_src_tex_name(0)
	, m_test_case_index(0)
{
	testCase test_case;

	static const GLsizei n_samples[2] = { 1, 4 };

	static const GLenum targets[2] = { GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_2D_MULTISAMPLE_ARRAY };

	for (GLuint src_sample = 0; src_sample < 2; ++src_sample)
	{
		for (GLuint dst_sample = 0; dst_sample < 2; ++dst_sample)
		{
			for (GLuint src_target = 0; src_target < 2; ++src_target)
			{
				for (GLuint dst_target = 0; dst_target < 2; ++dst_target)
				{
					test_case.m_src_target	= targets[src_target];
					test_case.m_src_n_samples = n_samples[src_sample];
					test_case.m_dst_target	= targets[dst_target];
					test_case.m_dst_n_samples = n_samples[dst_sample];

					if (test_case.m_src_n_samples == test_case.m_dst_n_samples)
					{
						test_case.m_expected_result = GL_NO_ERROR;
					}
					else
					{
						test_case.m_expected_result = GL_INVALID_OPERATION;
					}

					m_test_cases.push_back(test_case);
				}
			}
		}
	}
}